

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix-test.cc
# Opt level: O0

void __thiscall FileTest_CloseError_Test::TestBody(FileTest_CloseError_Test *this)

{
  bool bVar1;
  int iVar2;
  file *this_00;
  AssertHelper *this_01;
  AssertionResult gtest_ar_1;
  system_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  file f;
  int in_stack_0000015c;
  undefined1 in_stack_00000160 [16];
  char *in_stack_fffffffffffffef8;
  basic_string_view<char> *in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  char *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  Type in_stack_ffffffffffffff2c;
  AssertionResult *in_stack_ffffffffffffff30;
  AssertionResult local_98;
  Message *in_stack_ffffffffffffff78;
  AssertHelper *in_stack_ffffffffffffff80;
  string local_50 [32];
  AssertionResult local_30 [2];
  file local_c [3];
  
  open_file();
  iVar2 = fmt::v5::file::descriptor(local_c);
  close(iVar2);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_30);
  if (bVar1) {
    fmt::v5::basic_string_view<char>::basic_string_view
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    iVar2 = 9;
    format_system_error_abi_cxx11_(in_stack_0000015c,(string_view)in_stack_00000160);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::file::close(local_c,iVar2);
    }
    testing::AssertionResult::operator<<
              (in_stack_ffffffffffffff30,
               (char (*) [96])CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::__cxx11::string::~string(local_50);
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff30);
  this_00 = (file *)testing::AssertionResult::failure_message((AssertionResult *)0x115264);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
             in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)this_00);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffff00);
  testing::Message::~Message((Message *)0x1152c1);
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x115316);
  fmt::v5::file::descriptor(local_c);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),(char *)this_00,
             (int *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
             (int *)in_stack_ffffffffffffff00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff30);
    this_01 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x1153b3)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,(char *)this_00);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    testing::internal::AssertHelper::~AssertHelper(this_01);
    testing::Message::~Message((Message *)0x115401);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11544d);
  fmt::v5::file::~file(this_00);
  return;
}

Assistant:

TEST(FileTest, CloseError) {
  file f = open_file();
  FMT_POSIX(close(f.descriptor()));
  EXPECT_SYSTEM_ERROR_NOASSERT(f.close(), EBADF, "cannot close file");
  EXPECT_EQ(-1, f.descriptor());
}